

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O3

void __thiscall FArchive::WriteName(FArchive *this,char *name)

{
  bool bVar1;
  DWORD DVar2;
  undefined8 in_RAX;
  BYTE id;
  undefined8 uStack_28;
  
  if (name == (char *)0x0) {
    uStack_28._7_1_ = (undefined1)((ulong)in_RAX >> 0x38);
    uStack_28._0_6_ = (undefined6)in_RAX;
    uStack_28._0_7_ = CONCAT16(0x21,(undefined6)uStack_28);
    (*this->_vptr_FArchive[2])(this,(long)&uStack_28 + 6,1);
  }
  else {
    uStack_28 = in_RAX;
    DVar2 = FindName(this,name);
    if (DVar2 == 0xffffffff) {
      AddName(this,name);
      uStack_28._0_7_ = CONCAT16(0x1b,(undefined6)uStack_28);
      (*this->_vptr_FArchive[2])(this,(long)&uStack_28 + 6,1);
      WriteString(this,name);
    }
    else {
      uStack_28._0_7_ = CONCAT16(0x1c,(undefined6)uStack_28);
      (*this->_vptr_FArchive[2])(this,(long)&uStack_28 + 6,1);
      do {
        uStack_28 = CONCAT17((0x7f < DVar2) << 7 | (byte)DVar2 & 0x7f,(undefined7)uStack_28);
        (*this->_vptr_FArchive[2])(this,(long)&uStack_28 + 7,1);
        bVar1 = 0x7f < DVar2;
        DVar2 = DVar2 >> 7;
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void FArchive::WriteName (const char *name)
{
	BYTE id;

	if (name == NULL)
	{
		id = NIL_NAME;
		Write (&id, 1);
	}
	else
	{
		DWORD index = FindName (name);
		if (index != NameMap::NO_INDEX)
		{
			id = OLD_NAME;
			Write (&id, 1);
			WriteCount (index);
		}
		else
		{
			AddName (name);
			id = NEW_NAME;
			Write (&id, 1);
			WriteString (name);
		}
	}
}